

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaintype.cpp
# Opt level: O3

optional<ChainType> ChainTypeFromString(string_view chain)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int *__s1;
  size_t __n;
  long in_FS_OFFSET;
  
  __s1 = (int *)chain._M_str;
  __n = chain._M_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  switch(__n) {
  case 4:
    uVar3 = 0x100000000;
    if (*__s1 == 0x6e69616d) {
      uVar4 = 0;
      goto LAB_00133b34;
    }
    if (*__s1 == 0x74736574) {
      uVar4 = 1;
      goto LAB_00133b34;
    }
    break;
  case 6:
    iVar2 = bcmp(__s1,"signet",__n);
    if (iVar2 == 0) {
      uVar3 = 0x100000000;
      uVar4 = 2;
      goto LAB_00133b34;
    }
    break;
  case 7:
    iVar2 = bcmp(__s1,"regtest",__n);
    if (iVar2 == 0) {
      uVar3 = 0x100000000;
      uVar4 = 3;
      goto LAB_00133b34;
    }
    break;
  case 8:
    iVar2 = bcmp(__s1,"testnet4",__n);
    if (iVar2 == 0) {
      uVar3 = 0x100000000;
      uVar4 = 4;
      goto LAB_00133b34;
    }
  }
  uVar4 = 0;
  uVar3 = 0;
LAB_00133b34:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<ChainType>)(uVar3 | uVar4);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<ChainType> ChainTypeFromString(std::string_view chain)
{
    if (chain == "main") {
        return ChainType::MAIN;
    } else if (chain == "test") {
        return ChainType::TESTNET;
    } else if (chain == "testnet4") {
        return ChainType::TESTNET4;
    } else if (chain == "signet") {
        return ChainType::SIGNET;
    } else if (chain == "regtest") {
        return ChainType::REGTEST;
    } else {
        return std::nullopt;
    }
}